

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O0

size_t duckdb_zstd::ZSTD_loadCEntropy
                 (ZSTD_compressedBlockState_t *bs,void *workspace,void *dict,size_t dictSize)

{
  uint uVar1;
  FSE_repeat FVar2;
  U32 UVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  ulong uVar8;
  long in_RCX;
  long in_RDX;
  long in_RDI;
  uint *in_stack_00000018;
  U32 u;
  U32 maxOffset;
  U32 offcodeMax;
  size_t dictContentSize;
  size_t litlengthHeaderSize;
  uint litlengthLog;
  uint litlengthMaxValue;
  short litlengthNCount [36];
  size_t matchlengthHeaderSize;
  uint matchlengthLog;
  uint matchlengthMaxValue;
  short matchlengthNCount [53];
  size_t offcodeHeaderSize;
  uint offcodeLog;
  size_t hufHeaderSize;
  uint hasZeroWeights;
  uint maxSymbolValue;
  BYTE *dictEnd;
  BYTE *dictPtr;
  uint offcodeMaxValue;
  short offcodeNCount [32];
  void *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  uint *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  uint local_194;
  uint local_180;
  short local_178 [40];
  size_t local_128;
  uint local_120;
  uint local_11c;
  short local_118 [32];
  size_t in_stack_ffffffffffffff28;
  void *in_stack_ffffffffffffff30;
  uint in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  short *in_stack_ffffffffffffff40;
  FSE_CTable *in_stack_ffffffffffffff48;
  uint local_94;
  short local_68 [36];
  long local_20;
  long local_10;
  size_t local_8;
  
  *(undefined4 *)(in_RDI + 0x808) = 1;
  local_20 = in_RDX;
  local_10 = in_RDI;
  sVar4 = HUF_readCTable(_litlengthLog,(uint *)litlengthHeaderSize,(void *)dictContentSize,
                         _maxOffset,in_stack_00000018);
  uVar1 = ERR_isError(sVar4);
  if (uVar1 == 0) {
    sVar5 = FSE_readNCount((short *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                           in_stack_fffffffffffffe58,
                           (uint *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                           in_stack_fffffffffffffe48,0x27e4516);
    uVar1 = ERR_isError(sVar5);
    if (uVar1 == 0) {
      if (local_94 < 9) {
        sVar6 = FSE_buildCTable_wksp
                          (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                           in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
                           in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        uVar1 = ERR_isError(sVar6);
        if (uVar1 == 0) {
          local_11c = 0x34;
          local_128 = FSE_readNCount((short *)CONCAT44(in_stack_fffffffffffffe64,
                                                       in_stack_fffffffffffffe60),
                                     in_stack_fffffffffffffe58,
                                     (uint *)CONCAT44(in_stack_fffffffffffffe54,
                                                      in_stack_fffffffffffffe50),
                                     in_stack_fffffffffffffe48,0x27e4645);
          uVar1 = ERR_isError(local_128);
          if (uVar1 == 0) {
            if (local_120 < 10) {
              sVar6 = FSE_buildCTable_wksp
                                (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                                 in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
                                 in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
              uVar1 = ERR_isError(sVar6);
              if (uVar1 == 0) {
                FVar2 = ZSTD_dictNCountRepeat(local_118,local_11c,0x34);
                *(FSE_repeat *)(local_10 + 0x15e8) = FVar2;
                lVar7 = local_128 + sVar5 + sVar4 + in_RDX + 8;
                sVar4 = FSE_readNCount((short *)CONCAT44(in_stack_fffffffffffffe64,
                                                         in_stack_fffffffffffffe60),
                                       in_stack_fffffffffffffe58,
                                       (uint *)CONCAT44(in_stack_fffffffffffffe54,
                                                        in_stack_fffffffffffffe50),
                                       in_stack_fffffffffffffe48,0x27e479a);
                uVar1 = ERR_isError(sVar4);
                if (uVar1 == 0) {
                  if (local_180 < 10) {
                    sVar5 = FSE_buildCTable_wksp
                                      (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                                       in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
                                       in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
                    uVar1 = ERR_isError(sVar5);
                    if (uVar1 == 0) {
                      FVar2 = ZSTD_dictNCountRepeat(local_178,0x23,0x23);
                      *(FSE_repeat *)(local_10 + 0x15ec) = FVar2;
                      lVar7 = sVar4 + lVar7;
                      if ((ulong)(in_RDX + in_RCX) < lVar7 + 0xcU) {
                        local_8 = 0xffffffffffffffe2;
                      }
                      else {
                        UVar3 = MEM_readLE32(in_stack_fffffffffffffe48);
                        *(U32 *)(local_10 + 0x15f0) = UVar3;
                        UVar3 = MEM_readLE32(in_stack_fffffffffffffe48);
                        *(U32 *)(local_10 + 0x15f4) = UVar3;
                        UVar3 = MEM_readLE32(in_stack_fffffffffffffe48);
                        *(U32 *)(local_10 + 0x15f8) = UVar3;
                        lVar7 = lVar7 + 0xc;
                        uVar8 = (in_RDX + in_RCX) - lVar7;
                        local_194 = 0x1f;
                        if (uVar8 < 0xfffe0000) {
                          local_194 = ZSTD_highbit32(0);
                        }
                        if (0x1e < local_194) {
                          local_194 = 0x1f;
                        }
                        FVar2 = ZSTD_dictNCountRepeat(local_68,0x1f,local_194);
                        *(FSE_repeat *)(local_10 + 0x15e4) = FVar2;
                        for (uVar1 = 0; uVar1 < 3; uVar1 = uVar1 + 1) {
                          if (*(int *)(local_10 + 0x15f0 + (ulong)uVar1 * 4) == 0) {
                            return 0xffffffffffffffe2;
                          }
                          if (uVar8 < *(uint *)(local_10 + 0x15f0 + (ulong)uVar1 * 4)) {
                            return 0xffffffffffffffe2;
                          }
                        }
                        local_8 = lVar7 - local_20;
                      }
                    }
                    else {
                      local_8 = 0xffffffffffffffe2;
                    }
                  }
                  else {
                    local_8 = 0xffffffffffffffe2;
                  }
                }
                else {
                  local_8 = 0xffffffffffffffe2;
                }
              }
              else {
                local_8 = 0xffffffffffffffe2;
              }
            }
            else {
              local_8 = 0xffffffffffffffe2;
            }
          }
          else {
            local_8 = 0xffffffffffffffe2;
          }
        }
        else {
          local_8 = 0xffffffffffffffe2;
        }
      }
      else {
        local_8 = 0xffffffffffffffe2;
      }
    }
    else {
      local_8 = 0xffffffffffffffe2;
    }
  }
  else {
    local_8 = 0xffffffffffffffe2;
  }
  return local_8;
}

Assistant:

size_t ZSTD_loadCEntropy(ZSTD_compressedBlockState_t* bs, void* workspace,
                         const void* const dict, size_t dictSize)
{
    short offcodeNCount[MaxOff+1];
    unsigned offcodeMaxValue = MaxOff;
    const BYTE* dictPtr = (const BYTE*)dict;    /* skip magic num and dict ID */
    const BYTE* const dictEnd = dictPtr + dictSize;
    dictPtr += 8;
    bs->entropy.huf.repeatMode = HUF_repeat_check;

    {   unsigned maxSymbolValue = 255;
        unsigned hasZeroWeights = 1;
        size_t const hufHeaderSize = HUF_readCTable((HUF_CElt*)bs->entropy.huf.CTable, &maxSymbolValue, dictPtr,
            dictEnd-dictPtr, &hasZeroWeights);

        /* We only set the loaded table as valid if it contains all non-zero
         * weights. Otherwise, we set it to check */
        if (!hasZeroWeights && maxSymbolValue == 255)
            bs->entropy.huf.repeatMode = HUF_repeat_valid;

        RETURN_ERROR_IF(HUF_isError(hufHeaderSize), dictionary_corrupted, "");
        dictPtr += hufHeaderSize;
    }

    {   unsigned offcodeLog;
        size_t const offcodeHeaderSize = FSE_readNCount(offcodeNCount, &offcodeMaxValue, &offcodeLog, dictPtr, dictEnd-dictPtr);
        RETURN_ERROR_IF(FSE_isError(offcodeHeaderSize), dictionary_corrupted, "");
        RETURN_ERROR_IF(offcodeLog > OffFSELog, dictionary_corrupted, "");
        /* fill all offset symbols to avoid garbage at end of table */
        RETURN_ERROR_IF(FSE_isError(FSE_buildCTable_wksp(
                bs->entropy.fse.offcodeCTable,
                offcodeNCount, MaxOff, offcodeLog,
                workspace, HUF_WORKSPACE_SIZE)),
            dictionary_corrupted, "");
        /* Defer checking offcodeMaxValue because we need to know the size of the dictionary content */
        dictPtr += offcodeHeaderSize;
    }

    {   short matchlengthNCount[MaxML+1];
        unsigned matchlengthMaxValue = MaxML, matchlengthLog;
        size_t const matchlengthHeaderSize = FSE_readNCount(matchlengthNCount, &matchlengthMaxValue, &matchlengthLog, dictPtr, dictEnd-dictPtr);
        RETURN_ERROR_IF(FSE_isError(matchlengthHeaderSize), dictionary_corrupted, "");
        RETURN_ERROR_IF(matchlengthLog > MLFSELog, dictionary_corrupted, "");
        RETURN_ERROR_IF(FSE_isError(FSE_buildCTable_wksp(
                bs->entropy.fse.matchlengthCTable,
                matchlengthNCount, matchlengthMaxValue, matchlengthLog,
                workspace, HUF_WORKSPACE_SIZE)),
            dictionary_corrupted, "");
        bs->entropy.fse.matchlength_repeatMode = ZSTD_dictNCountRepeat(matchlengthNCount, matchlengthMaxValue, MaxML);
        dictPtr += matchlengthHeaderSize;
    }

    {   short litlengthNCount[MaxLL+1];
        unsigned litlengthMaxValue = MaxLL, litlengthLog;
        size_t const litlengthHeaderSize = FSE_readNCount(litlengthNCount, &litlengthMaxValue, &litlengthLog, dictPtr, dictEnd-dictPtr);
        RETURN_ERROR_IF(FSE_isError(litlengthHeaderSize), dictionary_corrupted, "");
        RETURN_ERROR_IF(litlengthLog > LLFSELog, dictionary_corrupted, "");
        RETURN_ERROR_IF(FSE_isError(FSE_buildCTable_wksp(
                bs->entropy.fse.litlengthCTable,
                litlengthNCount, litlengthMaxValue, litlengthLog,
                workspace, HUF_WORKSPACE_SIZE)),
            dictionary_corrupted, "");
        bs->entropy.fse.litlength_repeatMode = ZSTD_dictNCountRepeat(litlengthNCount, litlengthMaxValue, MaxLL);
        dictPtr += litlengthHeaderSize;
    }

    RETURN_ERROR_IF(dictPtr+12 > dictEnd, dictionary_corrupted, "");
    bs->rep[0] = MEM_readLE32(dictPtr+0);
    bs->rep[1] = MEM_readLE32(dictPtr+4);
    bs->rep[2] = MEM_readLE32(dictPtr+8);
    dictPtr += 12;

    {   size_t const dictContentSize = (size_t)(dictEnd - dictPtr);
        U32 offcodeMax = MaxOff;
        if (dictContentSize <= ((U32)-1) - 128 KB) {
            U32 const maxOffset = (U32)dictContentSize + 128 KB; /* The maximum offset that must be supported */
            offcodeMax = ZSTD_highbit32(maxOffset); /* Calculate minimum offset code required to represent maxOffset */
        }
        /* All offset values <= dictContentSize + 128 KB must be representable for a valid table */
        bs->entropy.fse.offcode_repeatMode = ZSTD_dictNCountRepeat(offcodeNCount, offcodeMaxValue, MIN(offcodeMax, MaxOff));

        /* All repCodes must be <= dictContentSize and != 0 */
        {   U32 u;
            for (u=0; u<3; u++) {
                RETURN_ERROR_IF(bs->rep[u] == 0, dictionary_corrupted, "");
                RETURN_ERROR_IF(bs->rep[u] > dictContentSize, dictionary_corrupted, "");
    }   }   }

    return dictPtr - (const BYTE*)dict;
}